

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O0

void __thiscall
GmmLib::GmmPageTablePool::GmmPageTablePool
          (GmmPageTablePool *this,HANDLE hAlloc,GMM_RESOURCE_INFO *pGmmRes,GMM_GFX_ADDRESS SysMem,
          POOL_TYPE Type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  WA_TABLE *pWVar4;
  ulong uVar5;
  uint32_t *__s;
  ulong uVar6;
  SyncInfo *pSVar7;
  bool bVar8;
  SyncInfoLin *local_f8;
  SyncInfo *local_f0;
  uint32_t *local_d0;
  int local_b8;
  int local_b4;
  Context *local_98;
  GMM_LIB_CONTEXT *pGmmLibContext;
  int DwordPoolSize;
  POOL_TYPE Type_local;
  GMM_GFX_ADDRESS SysMem_local;
  GMM_RESOURCE_INFO *pGmmRes_local;
  HANDLE hAlloc_local;
  GmmPageTablePool *this_local;
  
  GmmPageTablePool(this);
  this->PoolHandle = hAlloc;
  this->pGmmResInfo = pGmmRes;
  this->PoolGfxAddress = SysMem;
  this->CPUAddress = this->PoolGfxAddress;
  this->NextPool = (GmmPageTablePool *)0x0;
  this->NumFreeNodes = 0x200;
  this->PoolType = Type;
  if (this->pGmmResInfo != (GMM_RESOURCE_INFO *)0x0) {
    iVar3 = (*(this->pGmmResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x1b])();
    this->pClientContext = (GmmClientContext *)CONCAT44(extraout_var,iVar3);
  }
  if (this->pClientContext == (GmmClientContext *)0x0) {
    local_98 = (Context *)0x0;
  }
  else {
    iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    local_98 = (Context *)CONCAT44(extraout_var_00,iVar3);
  }
  if (Type == POOL_TYPE_AUXTTL1) {
    if (local_98 == (Context *)0x0) {
      local_b4 = 2;
    }
    else {
      pWVar4 = Context::GetWaTable(local_98);
      bVar8 = true;
      if (((uint)((ulong)*(undefined8 *)&pWVar4->field_0x4 >> 0x2f) & 1) == 0) {
        pWVar4 = Context::GetWaTable(local_98);
        bVar8 = (*(ulong *)&pWVar4->field_0x4 >> 0x2e & 1) != 0;
      }
      local_b4 = 1;
      if (bVar8) {
        local_b4 = 2;
      }
    }
    local_b8 = (int)(0x10 / (ulong)(long)local_b4);
  }
  else {
    local_b8 = 0x10;
    if (Type == POOL_TYPE_AUXTTL2) {
      local_b8 = 2;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_b8;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = (uint32_t *)operator_new__(uVar5);
  local_d0 = (uint32_t *)0x0;
  if (__s != (uint32_t *)0x0) {
    memset(__s,0,uVar5);
    local_d0 = __s;
  }
  this->NodeUsage = local_d0;
  uVar5 = (ulong)(local_b8 << 5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pSVar7 = (SyncInfo *)operator_new__(uVar6);
  local_f0 = (SyncInfo *)0x0;
  if ((pSVar7 != (SyncInfo *)0x0) && (local_f0 = pSVar7, uVar5 != 0)) {
    local_f8 = pSVar7;
    do {
      SyncInfoLin::SyncInfoLin(local_f8);
      local_f8 = local_f8 + 1;
    } while (local_f8 != pSVar7 + uVar5);
  }
  this->NodeBBInfo = local_f0;
  return;
}

Assistant:

GmmPageTablePool(HANDLE hAlloc, GMM_RESOURCE_INFO* pGmmRes, GMM_GFX_ADDRESS SysMem, POOL_TYPE Type) :
            GmmPageTablePool()
        {
            int              DwordPoolSize;
            GMM_LIB_CONTEXT *pGmmLibContext;
            PoolHandle     = hAlloc;
            pGmmResInfo    = pGmmRes;
            PoolGfxAddress = SysMem;
            CPUAddress     = PoolGfxAddress;
            NextPool       = NULL;
            NumFreeNodes   = PAGETABLE_POOL_MAX_NODES;
            PoolType       = Type;
            if(pGmmResInfo)
            {
                pClientContext = pGmmResInfo->GetGmmClientContext();
            }
            pGmmLibContext = pClientContext ? pClientContext->GetLibContext() : NULL;
            DwordPoolSize  = (Type == POOL_TYPE_AUXTTL1) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L1TABLE_SIZE_IN_POOLNODES_2(pGmmLibContext) : (Type == POOL_TYPE_AUXTTL2) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L2TABLE_SIZE_IN_POOLNODES : PAGETABLE_POOL_SIZE_IN_DWORD;
            NodeUsage      = new uint32_t[DwordPoolSize]();
            NodeBBInfo     = new SyncInfo[DwordPoolSize * 32]();
	}